

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeBoolConstant(Builder *this,bool b,bool specConstant)

{
  int iVar1;
  Id IVar2;
  Op OVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *this_00;
  int local_64;
  key_type local_54;
  value_type local_50;
  Instruction *local_48;
  Instruction *c;
  key_type local_38;
  int local_34;
  Id local_30;
  int i;
  Id existing;
  Op opcode;
  Instruction *constant;
  Id typeId;
  bool specConstant_local;
  bool b_local;
  Builder *this_local;
  
  constant._6_1_ = specConstant;
  constant._7_1_ = b;
  _typeId = this;
  constant._0_4_ = makeBoolType(this);
  if ((constant._6_1_ & 1) == 0) {
    local_64 = 0x2a;
    if ((constant._7_1_ & 1) != 0) {
      local_64 = 0x29;
    }
  }
  else {
    local_64 = 0x31;
    if ((constant._7_1_ & 1) != 0) {
      local_64 = 0x30;
    }
  }
  i = local_64;
  if ((constant._6_1_ & 1) == 0) {
    local_30 = 0;
    local_34 = 0;
    while( true ) {
      iVar1 = local_34;
      local_38 = 0x14;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedConstants,&local_38);
      sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
      if ((int)sVar5 <= iVar1) break;
      c._4_4_ = 0x14;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedConstants,(key_type *)((long)&c + 4));
      ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                          (pmVar4,(long)local_34);
      _existing = *ppIVar6;
      IVar2 = spv::Instruction::getTypeId(_existing);
      if ((IVar2 == (Id)constant) && (OVar3 = spv::Instruction::getOpCode(_existing), OVar3 == i)) {
        local_30 = spv::Instruction::getResultId(_existing);
      }
      local_34 = local_34 + 1;
    }
    if (local_30 != 0) {
      return local_30;
    }
  }
  this_00 = (Instruction *)::operator_new(0x60);
  IVar2 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar2,(Id)constant,i);
  local_48 = this_00;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_50,this_00
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,&local_50);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_50);
  local_54 = 0x14;
  pmVar4 = std::
           unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
           ::operator[](&this->groupedConstants,&local_54);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(pmVar4,&local_48);
  Module::mapInstruction(&this->module,local_48);
  IVar2 = spv::Instruction::getResultId(local_48);
  return IVar2;
}

Assistant:

Id Builder::makeBoolConstant(bool b, bool specConstant)
{
    Id typeId = makeBoolType();
    Instruction* constant;
    Op opcode = specConstant ? (b ? OpSpecConstantTrue : OpSpecConstantFalse) : (b ? OpConstantTrue : OpConstantFalse);

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = 0;
        for (int i = 0; i < (int)groupedConstants[OpTypeBool].size(); ++i) {
            constant = groupedConstants[OpTypeBool][i];
            if (constant->getTypeId() == typeId && constant->getOpCode() == opcode)
                existing = constant->getResultId();
        }

        if (existing)
            return existing;
    }

    // Make it
    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeBool].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}